

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::Type::Object::Object(Object *this,Allocator *a,Object *other)

{
  char *in_RCX;
  long lVar1;
  MemberNameAndType *pMVar2;
  string_view sVar3;
  string_view s;
  MemberNameAndType local_60;
  
  sVar3._M_str = in_RCX;
  sVar3._M_len = (size_t)(other->className)._M_str;
  sVar3 = anon_unknown_11::allocateString
                    ((anon_unknown_11 *)a,(Allocator *)(other->className)._M_len,sVar3);
  this->className = sVar3;
  (this->members).items = (MemberNameAndType *)0x0;
  (this->members).size = 0;
  (this->members).capacity = 0;
  (this->members).allocator = a;
  AllocatedVector<choc::value::MemberNameAndType>::reserve(&this->members,(other->members).size);
  pMVar2 = (other->members).items;
  for (lVar1 = (ulong)(other->members).size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    s._M_str = in_RCX;
    s._M_len = (size_t)(pMVar2->name)._M_str;
    local_60.name =
         anon_unknown_11::allocateString((anon_unknown_11 *)a,(Allocator *)(pMVar2->name)._M_len,s);
    Type(&local_60.type,a,&pMVar2->type);
    AllocatedVector<choc::value::MemberNameAndType>::push_back(&this->members,&local_60);
    deleteAllocatedObjects(&local_60.type);
    pMVar2 = pMVar2 + 1;
  }
  return;
}

Assistant:

Object (Allocator* a, const Object& other) : className (allocateString (a, other.className)), members (a)
    {
        members.reserve (other.members.size);

        for (auto& m : other.members)
            members.push_back ({ allocateString (a, m.name), Type (a, m.type) });
    }